

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

bool __thiscall S2CellUnion::Decode(S2CellUnion *this,Decoder *decoder)

{
  byte bVar1;
  byte *pbVar2;
  ulong __n;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  allocator_type local_49;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_48;
  
  sVar7 = Decoder::avail(decoder);
  if (8 < sVar7) {
    pbVar2 = decoder->buf_;
    bVar1 = *pbVar2;
    decoder->buf_ = pbVar2 + 1;
    if (bVar1 < 2) {
      __n = *(ulong *)(pbVar2 + 1);
      decoder->buf_ = pbVar2 + 9;
      if (__n <= (ulong)(long)FLAGS_s2cell_union_decode_max_num_cells) {
        std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
                  ((vector<S2CellId,_std::allocator<S2CellId>_> *)&local_48,__n,&local_49);
        lVar8 = 1;
        lVar9 = 0;
        do {
          if (__n + lVar8 == 1) {
            pSVar3 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
            pSVar4 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pSVar5 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
            super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
            (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
            super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
            bVar6 = true;
            local_48._M_impl.super__Vector_impl_data._M_start = pSVar4;
            local_48._M_impl.super__Vector_impl_data._M_finish = pSVar5;
            local_48._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3;
            goto LAB_00220b68;
          }
          bVar6 = S2CellId::Decode((S2CellId *)
                                   ((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->id_
                                   + lVar9),decoder);
          lVar8 = lVar8 + -1;
          lVar9 = lVar9 + 8;
        } while (bVar6);
        bVar6 = __n <= (ulong)-lVar8;
LAB_00220b68:
        std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_48);
        return bVar6;
      }
    }
  }
  return false;
}

Assistant:

bool S2CellUnion::Decode(Decoder* const decoder) {
  // Should contain at least version and vector length.
  if (decoder->avail() < sizeof(unsigned char) + sizeof(uint64)) return false;
  unsigned char version = decoder->get8();
  if (version > kCurrentLosslessEncodingVersionNumber) return false;

  uint64 num_cells = decoder->get64();
  if (num_cells > FLAGS_s2cell_union_decode_max_num_cells) {
    return false;
  }

  vector<S2CellId> temp_cell_ids(num_cells);
  for (int i = 0; i < num_cells; ++i) {
    if (!temp_cell_ids[i].Decode(decoder)) return false;
  }
  cell_ids_.swap(temp_cell_ids);
  return true;
}